

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void r4k_helper_tlbp_mips64(CPUMIPSState_conflict5 *env)

{
  uint uVar1;
  ulong uVar2;
  CPUMIPSTLBContext_conflict1 *pCVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  ushort *puVar9;
  uint uVar10;
  
  uVar1 = env->CP0_Config5;
  uVar2 = env->CP0_EntryHi;
  if ((uVar1 >> 0x11 & 1) == 0) {
    uVar4 = (uint)(ushort)env->CP0_EntryHi_ASID_mask & (uint)uVar2;
  }
  else {
    uVar4 = env->CP0_MemoryMapID;
  }
  pCVar3 = env->tlb;
  uVar5 = pCVar3->nb_tlb;
  uVar6 = (ulong)uVar5;
  puVar9 = (ushort *)((long)&pCVar3->mmu + 0x14);
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    if ((uVar1 >> 0x11 & 1) == 0) {
      uVar10 = (uint)puVar9[-4];
    }
    else {
      uVar10 = *(uint *)(puVar9 + -2);
    }
    if (((((*puVar9 & 1) != 0) || (uVar10 == uVar4)) &&
        (((env->SEGMask & uVar2 ^ *(ulong *)(puVar9 + -10)) &
         ~(ulong)*(uint *)(puVar9 + -6) & 0xffffffffffffe000) == 0)) && (-1 < (short)*puVar9)) {
      env->CP0_Index = (uint)uVar8;
      if (uVar5 != (uint)uVar8) {
        return;
      }
      break;
    }
    puVar9 = puVar9 + 0x14;
  }
  pbVar7 = (byte *)((long)&pCVar3->mmu + (long)(int)uVar5 * 0x28 + 0x14);
  do {
    uVar5 = (uint)uVar6;
    if (pCVar3->tlb_in_use <= uVar5) {
LAB_007dda47:
      pbVar7 = (byte *)((long)&env->CP0_Index + 3);
      *pbVar7 = *pbVar7 | 0x80;
      return;
    }
    if ((uVar1 >> 0x11 & 1) == 0) {
      uVar10 = (uint)*(ushort *)(pbVar7 + -8);
    }
    else {
      uVar10 = *(uint *)(pbVar7 + -4);
    }
    if ((((*pbVar7 & 1) != 0) || (uVar10 == uVar4)) &&
       (((env->SEGMask & uVar2 ^ *(ulong *)(pbVar7 + -0x14)) &
        ~(ulong)*(uint *)(pbVar7 + -0xc) & 0xffffffffffffe000) == 0)) {
      r4k_mips_tlb_flush_extra(env,uVar5);
      goto LAB_007dda47;
    }
    pbVar7 = pbVar7 + 0x28;
    uVar6 = (ulong)(uVar5 + 1);
  } while( true );
}

Assistant:

void r4k_helper_tlbp(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    r4k_tlb_t *tlb;
    target_ulong mask;
    target_ulong tag;
    target_ulong VPN;
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;
    for (i = 0; i < env->tlb->nb_tlb; i++) {
        tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        tag = env->CP0_EntryHi & ~mask;
        VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        /* Check ASID/MMID, virtual page number & size */
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            env->CP0_Index = i;
            break;
        }
    }
    if (i == env->tlb->nb_tlb) {
        /* No match.  Discard any shadow entries, if any of them match.  */
        for (i = env->tlb->nb_tlb; i < env->tlb->tlb_in_use; i++) {
            tlb = &env->tlb->mmu.r4k.tlb[i];
            /* 1k pages are not supported. */
            mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
            tag = env->CP0_EntryHi & ~mask;
            VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
            tag &= env->SEGMask;
#endif
            tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
            /* Check ASID/MMID, virtual page number & size */
            if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag) {
                r4k_mips_tlb_flush_extra(env, i);
                break;
            }
        }

        env->CP0_Index |= 0x80000000;
    }
}